

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O1

void __thiscall
webfront::http::std::experimental::net::v1::detail::
consuming_buffers<std::experimental::net::v1::const_buffer,_std::vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>,___gnu_cxx::__normal_iterator<const_std::experimental::net::v1::const_buffer_*,_std::vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>_>_>
::consuming_buffers(consuming_buffers<std::experimental::net::v1::const_buffer,_std::vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>,___gnu_cxx::__normal_iterator<const_std::experimental::net::v1::const_buffer_*,_std::vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>_>_>
                    *this,vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                          *buffers)

{
  size_t sVar1;
  __normal_iterator<const_std::experimental::net::v1::const_buffer_*,_std::vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>_>
  iter;
  pointer pcVar2;
  
  vector<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ::vector(&this->buffers_,buffers);
  this->total_consumed_ = 0;
  this->next_elem_ = 0;
  this->next_elem_offset_ = 0;
  sVar1 = 0;
  for (pcVar2 = (buffers->
                super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 != (buffers->
                super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
                )._M_impl.super__Vector_impl_data._M_finish; pcVar2 = pcVar2 + 1) {
    sVar1 = sVar1 + pcVar2->size_;
  }
  this->total_size_ = sVar1;
  return;
}

Assistant:

explicit consuming_buffers(const Buffers& buffers)
    : buffers_(buffers),
      total_consumed_(0),
      next_elem_(0),
      next_elem_offset_(0)
  {
    using std::experimental::net::v1::buffer_size;
    total_size_ = buffer_size(buffers);
  }